

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libnbt.cpp
# Opt level: O3

ssize_t __thiscall
libnbt::NBTTagVector<signed_char>::write
          (NBTTagVector<signed_char> *this,int __fd,void *__buf,size_t __n)

{
  ssize_t extraout_RAX;
  ssize_t sVar1;
  undefined4 in_register_00000034;
  long lVar2;
  char temp;
  int32_t size;
  char local_2d;
  int local_2c;
  
  local_2c = *(int *)&(this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
             *(int *)&(this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
                      _M_impl.super__Vector_impl_data._M_start;
  writeBytes((ostream *)CONCAT44(in_register_00000034,__fd),(char *)&local_2c,'\x04');
  sVar1 = extraout_RAX;
  if (0 < local_2c) {
    lVar2 = 0;
    do {
      local_2d = (this->array).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl
                 .super__Vector_impl_data._M_start[lVar2];
      writeBytes((ostream *)CONCAT44(in_register_00000034,__fd),&local_2d,width);
      lVar2 = lVar2 + 1;
      sVar1 = (ssize_t)local_2c;
    } while (lVar2 < sVar1);
  }
  return sVar1;
}

Assistant:

void NBTTagVector<T>::write(std::ostream &out) {
        auto size = (int32_t) array.size();
        writeBytes(out, (char *) &size, 4);
        for (int i = 0; i < size; i++) {
            T temp = array[i];
            writeBytes(out, (char *) &temp, width);
        }
    }